

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O1

void Fxch_ManFree(Fxch_Man_t *pFxchMan)

{
  Vec_Wec_t *pVVar1;
  void *pvVar2;
  Vec_Int_t *pVVar3;
  Hsh_VecMan_t *__ptr;
  Vec_Flt_t *__ptr_00;
  Vec_Que_t *__ptr_01;
  long lVar4;
  long lVar5;
  
  pVVar1 = pFxchMan->vLits;
  if (0 < pVVar1->nCap) {
    lVar5 = 8;
    lVar4 = 0;
    do {
      pvVar2 = *(void **)((long)&pVVar1->pArray->nCap + lVar5);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)&pVVar1->pArray->nCap + lVar5) = 0;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar4 < pVVar1->nCap);
  }
  if (pVVar1->pArray != (Vec_Int_t *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (Vec_Int_t *)0x0;
  }
  pVVar1->nCap = 0;
  pVVar1->nSize = 0;
  free(pVVar1);
  pVVar3 = pFxchMan->vLitCount;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar3 = pFxchMan->vLitHashKeys;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  __ptr = pFxchMan->pDivHash;
  pVVar3 = __ptr->vTable;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar3 = __ptr->vData;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar3 = __ptr->vMap;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  free(__ptr);
  __ptr_00 = pFxchMan->vDivWeights;
  if (__ptr_00->pArray != (float *)0x0) {
    free(__ptr_00->pArray);
    __ptr_00->pArray = (float *)0x0;
  }
  if (__ptr_00 != (Vec_Flt_t *)0x0) {
    free(__ptr_00);
  }
  __ptr_01 = pFxchMan->vDivPrio;
  if (__ptr_01->pOrder != (int *)0x0) {
    free(__ptr_01->pOrder);
    __ptr_01->pOrder = (int *)0x0;
  }
  if (__ptr_01->pHeap != (int *)0x0) {
    free(__ptr_01->pHeap);
    __ptr_01->pHeap = (int *)0x0;
  }
  if (__ptr_01 != (Vec_Que_t *)0x0) {
    free(__ptr_01);
  }
  pVVar1 = pFxchMan->vDivCubePairs;
  if (0 < pVVar1->nCap) {
    lVar5 = 8;
    lVar4 = 0;
    do {
      pvVar2 = *(void **)((long)&pVVar1->pArray->nCap + lVar5);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)&pVVar1->pArray->nCap + lVar5) = 0;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar4 < pVVar1->nCap);
  }
  if (pVVar1->pArray != (Vec_Int_t *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (Vec_Int_t *)0x0;
  }
  pVVar1->nCap = 0;
  pVVar1->nSize = 0;
  free(pVVar1);
  pVVar3 = pFxchMan->vLevels;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar3 = pFxchMan->vCubeFree;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar3 = pFxchMan->vDiv;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar3 = pFxchMan->vCubesS;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar3 = pFxchMan->vPairs;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar3 = pFxchMan->vCubesToUpdate;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar3 = pFxchMan->vCubesToRemove;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar3 = pFxchMan->vSCC;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  if (pFxchMan != (Fxch_Man_t *)0x0) {
    free(pFxchMan);
    return;
  }
  return;
}

Assistant:

void Fxch_ManFree( Fxch_Man_t* pFxchMan )
{
    Vec_WecFree( pFxchMan->vLits );
    Vec_IntFree( pFxchMan->vLitCount );
    Vec_IntFree( pFxchMan->vLitHashKeys );
    Hsh_VecManStop( pFxchMan->pDivHash );
    Vec_FltFree( pFxchMan->vDivWeights );
    Vec_QueFree( pFxchMan->vDivPrio );
    Vec_WecFree( pFxchMan->vDivCubePairs );
    Vec_IntFree( pFxchMan->vLevels );

    Vec_IntFree( pFxchMan->vCubeFree );
    Vec_IntFree( pFxchMan->vDiv );

    Vec_IntFree( pFxchMan->vCubesS );
    Vec_IntFree( pFxchMan->vPairs );
    Vec_IntFree( pFxchMan->vCubesToUpdate );
    Vec_IntFree( pFxchMan->vCubesToRemove );
    Vec_IntFree( pFxchMan->vSCC );

    ABC_FREE( pFxchMan );
}